

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O3

void uhash_setResizePolicy_63(UHashtable *hash,UHashResizePolicy policy)

{
  uint in_EAX;
  float fVar1;
  float fVar2;
  UErrorCode status;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  fVar1 = (float)*(undefined8 *)(RESIZE_POLICY_RATIO_TABLE + (int)(policy * 2));
  fVar2 = (float)((ulong)*(undefined8 *)(RESIZE_POLICY_RATIO_TABLE + (int)(policy * 2)) >> 0x20);
  hash->highWaterMark = (int)((float)hash->length * fVar2);
  hash->lowWaterMark = (int)((float)hash->length * fVar1);
  hash->highWaterRatio = fVar2;
  hash->lowWaterRatio = fVar1;
  _uhash_rehash(hash,(UErrorCode *)((long)&uStack_8 + 4));
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_setResizePolicy(UHashtable *hash, enum UHashResizePolicy policy) {
    UErrorCode status = U_ZERO_ERROR;
    _uhash_internalSetResizePolicy(hash, policy);
    hash->lowWaterMark  = (int32_t)(hash->length * hash->lowWaterRatio);
    hash->highWaterMark = (int32_t)(hash->length * hash->highWaterRatio);
    _uhash_rehash(hash, &status);
}